

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O1

bool draco::ReadFileToBuffer
               (string *file_name,vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  undefined1 uVar1;
  long *in_RAX;
  pointer *__ptr;
  unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
  file_reader;
  _Alloc_hider local_18;
  
  local_18._M_p = (pointer)in_RAX;
  FileReaderFactory::OpenReader((string *)&stack0xffffffffffffffe8);
  if ((long *)local_18._M_p == (long *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (**(code **)(*(long *)local_18._M_p + 0x18))(local_18._M_p,buffer);
  }
  if ((long *)local_18._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_18._M_p + 8))();
  }
  return (bool)uVar1;
}

Assistant:

bool ReadFileToBuffer(const std::string &file_name,
                      std::vector<uint8_t> *buffer) {
  std::unique_ptr<FileReaderInterface> file_reader =
      FileReaderFactory::OpenReader(file_name);
  if (file_reader == nullptr) {
    return false;
  }
  return file_reader->ReadFileToBuffer(buffer);
}